

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_element.c
# Opt level: O2

apx_dataElement_t * apx_dataElement_new(apx_typeCode_t type_code)

{
  apx_dataElement_t *self;
  
  self = (apx_dataElement_t *)malloc(0x38);
  if (self != (apx_dataElement_t *)0x0) {
    apx_dataElement_create(self,type_code);
  }
  return self;
}

Assistant:

apx_dataElement_t *apx_dataElement_new(apx_typeCode_t type_code)
{
   apx_dataElement_t *self = (apx_dataElement_t*) malloc(sizeof(apx_dataElement_t));
   if(self != NULL)
   {
      apx_error_t result = apx_dataElement_create(self, type_code);
      if (result != APX_NO_ERROR)
      {
         free(self);
         self = NULL;
      }
   }
   return self;
}